

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs8.cc
# Opt level: O2

int pkcs8_pbe_decrypt(uint8_t **out,size_t *out_len,CBS *algorithm,char *pass,size_t pass_len,
                     uint8_t *in,size_t in_len)

{
  long lVar1;
  int iVar2;
  uchar *out_00;
  int iVar3;
  long lVar4;
  int line;
  long lVar5;
  int n1;
  int n2;
  uint8_t **local_f0;
  size_t *local_e8;
  uint8_t *local_e0;
  CBS obj;
  ScopedEVP_CIPHER_CTX ctx;
  
  EVP_CIPHER_CTX_init((EVP_CIPHER_CTX *)&ctx);
  iVar2 = CBS_get_asn1(algorithm,&obj,6);
  if (iVar2 == 0) {
    iVar2 = 0x68;
    line = 0x149;
LAB_00200dad:
    iVar3 = 0;
    ERR_put_error(0x13,0,iVar2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs8.cc"
                  ,line);
  }
  else {
    lVar5 = 5;
    lVar1 = 0x2dc878;
    local_f0 = out;
    local_e8 = out_len;
    local_e0 = in;
    do {
      lVar4 = lVar1;
      lVar5 = lVar5 + -1;
      if (lVar5 == 0) {
        iVar2 = 0x77;
        line = 0x154;
        goto LAB_00200dad;
      }
      iVar2 = CBS_mem_equal(&obj,(uint8_t *)(lVar4 + 0x2c),(ulong)*(byte *)(lVar4 + 0x36));
      lVar1 = lVar4 + 0x28;
    } while (iVar2 == 0);
    iVar2 = (**(code **)(lVar4 + 0x48))(lVar4 + 0x28,&ctx,pass,pass_len,algorithm);
    if (iVar2 == 0) {
      iVar2 = 0x6d;
      line = 0x159;
      goto LAB_00200dad;
    }
    out_00 = (uchar *)OPENSSL_malloc(in_len);
    iVar3 = 0;
    if (out_00 != (uchar *)0x0) {
      if (in_len >> 0x1f != 0) {
        ERR_put_error(0x13,0,0x45,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs8.cc"
                      ,0x163);
        iVar3 = 0;
        goto LAB_00200db5;
      }
      iVar2 = EVP_DecryptUpdate((EVP_CIPHER_CTX *)&ctx,out_00,&n1,local_e0,(int)in_len);
      iVar3 = 0;
      if (iVar2 == 0) goto LAB_00200db5;
      iVar2 = EVP_DecryptFinal_ex((EVP_CIPHER_CTX *)&ctx,out_00 + n1,&n2);
      iVar3 = 0;
      if (iVar2 == 0) goto LAB_00200db5;
      *local_f0 = out_00;
      *local_e8 = (long)n2 + (long)n1;
      iVar3 = 1;
    }
  }
  out_00 = (uchar *)0x0;
LAB_00200db5:
  OPENSSL_free(out_00);
  EVP_CIPHER_CTX_cleanup((EVP_CIPHER_CTX *)&ctx);
  return iVar3;
}

Assistant:

int pkcs8_pbe_decrypt(uint8_t **out, size_t *out_len, CBS *algorithm,
                      const char *pass, size_t pass_len, const uint8_t *in,
                      size_t in_len) {
  int ret = 0;
  uint8_t *buf = NULL;
  bssl::ScopedEVP_CIPHER_CTX ctx;

  CBS obj;
  const struct pbe_suite *suite = NULL;
  if (!CBS_get_asn1(algorithm, &obj, CBS_ASN1_OBJECT)) {
    OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_DECODE_ERROR);
    goto err;
  }

  for (unsigned i = 0; i < OPENSSL_ARRAY_SIZE(kBuiltinPBE); i++) {
    if (CBS_mem_equal(&obj, kBuiltinPBE[i].oid, kBuiltinPBE[i].oid_len)) {
      suite = &kBuiltinPBE[i];
      break;
    }
  }
  if (suite == NULL) {
    OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_UNKNOWN_ALGORITHM);
    goto err;
  }

  if (!suite->decrypt_init(suite, ctx.get(), pass, pass_len, algorithm)) {
    OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_KEYGEN_FAILURE);
    goto err;
  }

  buf = reinterpret_cast<uint8_t *>(OPENSSL_malloc(in_len));
  if (buf == NULL) {
    goto err;
  }

  if (in_len > INT_MAX) {
    OPENSSL_PUT_ERROR(PKCS8, ERR_R_OVERFLOW);
    goto err;
  }

  int n1, n2;
  if (!EVP_DecryptUpdate(ctx.get(), buf, &n1, in, (int)in_len) ||
      !EVP_DecryptFinal_ex(ctx.get(), buf + n1, &n2)) {
    goto err;
  }

  *out = buf;
  *out_len = n1 + n2;
  ret = 1;
  buf = NULL;

err:
  OPENSSL_free(buf);
  return ret;
}